

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall
QCalendarBackend::dateTimeToString
          (QString *__return_storage_ptr__,QCalendarBackend *this,QStringView format,
          QDateTime *datetime,QDate dateOnly,QTime timeOnly,QLocale *locale)

{
  QChar fillChar;
  undefined1 auVar1 [16];
  bool bVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  storage_type_conflict *psVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  char32_t cVar13;
  int iVar14;
  int iVar15;
  time_t tVar16;
  uint extraout_var;
  qsizetype qVar17;
  int extraout_EDX;
  long lVar18;
  QCalendarBackend *__timer;
  ulong uVar19;
  long in_FS_OFFSET;
  QStringView format_00;
  QLatin1StringView s;
  QLatin1StringView str;
  QStringView QVar20;
  ulong local_100;
  QDateTime when;
  anon_class_8_1_5fb9ff98 tzAbbr;
  qsizetype i_1;
  undefined8 uStack_b0;
  undefined1 *local_a8;
  qsizetype i;
  anon_class_16_2_4001139c local_98;
  QArrayDataPointer<char16_t> local_88;
  QTime local_6c;
  QStringView format_local;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  format_local.m_data = format.m_data;
  format_local.m_size = format.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_6c.mds = -1;
  __timer = this;
  bVar9 = QDateTime::isValid(datetime);
  if (bVar9) {
    dateOnly = QDateTime::date(datetime);
    tVar16 = QDateTime::time(datetime,(time_t *)__timer);
    local_6c.mds = (int)tVar16;
    bVar9 = true;
    bVar2 = false;
  }
  else {
    bVar2 = true;
    bVar9 = true;
    if (0x16d3e147973 < dateOnly.jd + 0xb69eeff91fU) {
      bVar9 = QTime::isValid(&timeOnly);
      if (!bVar9) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        goto LAB_002df0b1;
      }
      local_6c.mds = timeOnly.mds;
      dateOnly.jd = -0x8000000000000000;
      bVar2 = false;
      bVar9 = false;
    }
  }
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  local_88.size = 0;
  iVar11 = 0;
  local_100 = 0;
  uVar19 = 0;
  if (bVar9) {
    iVar11 = (*this->_vptr_QCalendarBackend[0x11])(this,dateOnly.jd);
    uVar19 = CONCAT44(extraout_var,iVar11);
    local_100 = (ulong)extraout_var;
    iVar11 = extraout_EDX;
    if (local_100 != 0x80000000) goto LAB_002de7fd;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
LAB_002de7fd:
    local_98.locale = locale;
    i = 0;
    local_98.result = (QString *)&local_88;
    while (qVar17 = local_88.size, pcVar5 = local_88.ptr, pDVar4 = local_88.d, qVar3 = i,
          i < format_local.m_size) {
      fillChar.ucs = format_local.m_data[i];
      if (fillChar.ucs == L'\'') {
        format_00.m_data = format_local.m_data;
        format_00.m_size = format_local.m_size;
        qt_readEscapedFormatString((QString *)&local_58,format_00,&i);
        QString::append((QString *)&local_88,(QString *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      }
      else {
        QVar20 = QStringView::mid(&format_local,i,-1);
        qVar17 = qt_repeatCount(QVar20);
        iVar12 = (int)qVar17;
        if (bVar9) {
          if (fillChar.ucs == L'M') {
            iVar15 = 4;
            if (iVar12 < 4) {
              iVar15 = iVar12;
            }
            if (2 < iVar12) {
              (*this->_vptr_QCalendarBackend[0x14])
                        (&local_58,this,locale,local_100,uVar19,(ulong)(iVar12 == 3));
              QString::append((QString *)&local_88,(QString *)&local_58);
              goto LAB_002def46;
            }
            iVar14 = (int)local_100;
LAB_002dea4c:
            dateTimeToString::anon_class_16_2_4001139c::operator()(&local_98,iVar14,iVar15);
            iVar15 = iVar12;
          }
          else if (fillChar.ucs == L'd') {
            iVar15 = 4;
            if (iVar12 < 4) {
              iVar15 = iVar12;
            }
            iVar14 = iVar11;
            if (iVar12 < 3) goto LAB_002dea4c;
            iVar14 = (*this->_vptr_QCalendarBackend[0x12])(this,dateOnly.jd);
            QLocale::dayName((QString *)&local_58,locale,iVar14,(uint)(iVar12 == 3));
            QString::append((QString *)&local_88,(QString *)&local_58);
LAB_002def46:
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          }
          else {
            if (fillChar.ucs != L'y') goto LAB_002de918;
            if (iVar12 < 4) {
              if (iVar12 < 2) {
                QString::append((QString *)&local_88,(QChar)0x79);
                iVar15 = 1;
              }
              else {
                dateTimeToString::anon_class_16_2_4001139c::operator()
                          (&local_98,
                           (int)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 |
                                       uVar19 & 0xffffffff) % 100),2);
                iVar15 = 2;
              }
            }
            else {
              dateTimeToString::anon_class_16_2_4001139c::operator()
                        (&local_98,(int)uVar19,(uint)(uVar19 >> 0x1f) & 1 | 4);
              iVar15 = 4;
            }
          }
        }
        else {
LAB_002de918:
          if (bVar2) {
LAB_002de91f:
            QString::resize((QString *)&local_88,iVar12 + local_88.size,fillChar);
            iVar15 = iVar12;
          }
          else {
            if (fillChar.ucs == L'A') {
LAB_002dea64:
              local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              iVar12 = QTime::hour(&local_6c);
              if (iVar12 < 0xc) {
                QLocale::amText((QString *)&local_58,locale);
              }
              else {
                QLocale::pmText((QString *)&local_58,locale);
              }
              _i_1 = QStringView::mid(&format_local,qVar3 + 1,-1);
              bVar10 = QStringView::startsWith((QStringView *)&i_1,(QChar)0x70,CaseInsensitive);
              if (bVar10) {
                if (fillChar.ucs == L'a') {
                  iVar15 = 2;
                  iVar12 = 2;
                  if (format_local.m_data[qVar3 + 1] == L'p') {
LAB_002deeea:
                    iVar15 = iVar12;
                    QString::toLower_helper((QString *)&i_1,(QString *)&local_58);
                    goto LAB_002deefa;
                  }
                }
                else {
                  iVar15 = 2;
                  if (fillChar.ucs == L'A') {
                    iVar12 = 2;
                    iVar15 = 2;
                    if (format_local.m_data[qVar3 + 1] == L'P') goto LAB_002deec1;
                  }
                }
              }
              else {
                iVar12 = 1;
                if (fillChar.ucs == L'A') {
LAB_002deec1:
                  QString::toUpper_helper((QString *)&i_1,(QString *)&local_58);
                  iVar15 = iVar12;
LAB_002deefa:
                  qVar17 = local_58.size;
                  pDVar4 = local_58.d;
                  uVar7 = local_58.ptr._0_4_;
                  uVar8 = local_58.ptr._4_4_;
                  local_58.d = (Data *)i_1;
                  local_58.ptr = uStack_b0;
                  uStack_b0._0_4_ = uVar7;
                  i_1 = (qsizetype)pDVar4;
                  uStack_b0._4_4_ = uVar8;
                  local_58.size = (qsizetype)local_a8;
                  local_a8 = (undefined1 *)qVar17;
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&i_1);
                }
                else {
                  iVar15 = 1;
                  if (fillChar.ucs == L'a') goto LAB_002deeea;
                }
              }
              QString::append((QString *)&local_88,(QString *)&local_58);
              goto LAB_002def46;
            }
            if (fillChar.ucs == L'H') {
              iVar14 = QTime::hour(&local_6c);
              iVar15 = 2;
              if (iVar12 < 2) {
                iVar15 = iVar12;
              }
              dateTimeToString::anon_class_16_2_4001139c::operator()(&local_98,iVar14,iVar15);
            }
            else {
              if (fillChar.ucs == L'a') goto LAB_002dea64;
              if (fillChar.ucs == L'z') {
                iVar15 = QTime::msec(&local_6c);
                dateTimeToString::anon_class_16_2_4001139c::operator()(&local_98,iVar15,3);
                iVar15 = 3;
                if (iVar12 < 3) {
                  QLocale::zeroDigit((QString *)&local_58,locale);
                  bVar10 = QString::endsWith((QString *)&local_88,(QString *)&local_58,CaseSensitive
                                            );
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
                  if (bVar10) {
                    QString::chop((QString *)&local_88,1);
                  }
                  QLocale::zeroDigit((QString *)&local_58,locale);
                  bVar10 = QString::endsWith((QString *)&local_88,(QString *)&local_58,CaseSensitive
                                            );
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
                  iVar15 = iVar12;
                  if (bVar10) {
                    QString::chop((QString *)&local_88,1);
                  }
                }
              }
              else if (fillChar.ucs == L'm') {
                iVar14 = QTime::minute(&local_6c);
                iVar15 = 2;
                if (iVar12 < 2) {
                  iVar15 = iVar12;
                }
                dateTimeToString::anon_class_16_2_4001139c::operator()(&local_98,iVar14,iVar15);
              }
              else if (fillChar.ucs == L's') {
                iVar14 = QTime::second(&local_6c);
                iVar15 = 2;
                if (iVar12 < 2) {
                  iVar15 = iVar12;
                }
                dateTimeToString::anon_class_16_2_4001139c::operator()(&local_98,iVar14,iVar15);
              }
              else if (fillChar.ucs == L't') {
                tzAbbr.locale.d.d.ptr = (QLocale)&DAT_aaaaaaaaaaaaaaaa;
                QLocale::QLocale(&tzAbbr.locale,locale);
                iVar15 = 4;
                if (iVar12 < 4) {
                  iVar15 = iVar12;
                }
                when.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
                if (bVar9) {
                  QDateTime::QDateTime(&when,datetime);
                }
                else {
                  QDateTime::currentDateTime();
                }
                local_58.size = 0;
                local_58.d = (Data *)0x0;
                local_58.ptr = (char16_t *)0x0;
                if (iVar15 - 2U < 2) {
                  dateTimeToString::anon_class_8_1_5fb9ff98::operator()
                            ((QString *)&i_1,&tzAbbr,&when,Offset);
                  qVar17 = local_58.size;
                  pDVar4 = local_58.d;
                  uVar7 = local_58.ptr._0_4_;
                  uVar8 = local_58.ptr._4_4_;
                  local_58.d = (Data *)i_1;
                  local_58.ptr = uStack_b0;
                  uStack_b0._0_4_ = uVar7;
                  i_1 = (qsizetype)pDVar4;
                  uStack_b0._4_4_ = uVar8;
                  local_58.size = (qsizetype)local_a8;
                  local_a8 = (undefined1 *)qVar17;
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&i_1);
                  if (iVar12 == 2) {
                    QString::remove((QString *)&local_58,(char *)0x3a);
                  }
                }
                else if (iVar15 == 4) {
                  dateTimeToString::anon_class_8_1_5fb9ff98::operator()
                            ((QString *)&i_1,&tzAbbr,&when,Long);
                  qVar17 = local_58.size;
                  pDVar4 = local_58.d;
                  uVar7 = local_58.ptr._0_4_;
                  uVar8 = local_58.ptr._4_4_;
                  local_58.d = (Data *)i_1;
                  local_58.ptr = uStack_b0;
                  uStack_b0._0_4_ = uVar7;
                  i_1 = (qsizetype)pDVar4;
                  uStack_b0._4_4_ = uVar8;
                  local_58.size = (qsizetype)local_a8;
                  local_a8 = (undefined1 *)qVar17;
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&i_1);
                }
                else {
                  dateTimeToString::anon_class_8_1_5fb9ff98::operator()
                            ((QString *)&i_1,&tzAbbr,&when,Short);
                  qVar17 = local_58.size;
                  pDVar4 = local_58.d;
                  uVar7 = local_58.ptr._0_4_;
                  uVar8 = local_58.ptr._4_4_;
                  local_58.d = (Data *)i_1;
                  local_58.ptr = uStack_b0;
                  uStack_b0._0_4_ = uVar7;
                  i_1 = (qsizetype)pDVar4;
                  uStack_b0._4_4_ = uVar8;
                  local_58.size = (qsizetype)local_a8;
                  local_a8 = (undefined1 *)qVar17;
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&i_1);
                  s.m_data = "UTC";
                  s.m_size = 3;
                  bVar10 = QString::startsWith((QString *)&local_58,s,CaseSensitive);
                  if ((bVar10) && ((undefined1 *)local_58.size == (undefined1 *)0x6)) {
                    str.m_data = ":00";
                    str.m_size = 3;
                    QString::append((QString *)&local_58,str);
                  }
                }
                if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
                  QString::append((QString *)&local_88,(QString *)&local_58);
                }
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
                QDateTime::~QDateTime(&when);
                QLocale::~QLocale(&tzAbbr.locale);
              }
              else {
                if (fillChar.ucs != L'h') goto LAB_002de91f;
                iVar15 = 2;
                if (iVar12 < 2) {
                  iVar15 = iVar12;
                }
                iVar12 = QTime::hour(&local_6c);
                psVar6 = format_local.m_data;
                qVar17 = format_local.m_size;
                QVar20.m_data = format_local.m_data;
                QVar20.m_size = format_local.m_size;
                auVar1._8_8_ = 0;
                auVar1._0_8_ = uStack_b0;
                _i_1 = (QStringView)(auVar1 << 0x40);
                lVar18 = 0;
                while (lVar18 < qVar17) {
                  if ((uint)(ushort)psVar6[lVar18] == L'\'') {
                    qt_readEscapedFormatString((QString *)&local_58,QVar20,&i_1);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
                    lVar18 = i_1;
                  }
                  else {
                    cVar13 = QChar::toLower((uint)(ushort)psVar6[lVar18]);
                    if ((short)cVar13 == 0x61) {
                      if (iVar12 < 0xd) {
                        if (iVar12 == 0) {
                          iVar12 = 0xc;
                        }
                      }
                      else {
                        iVar12 = iVar12 + -0xc;
                      }
                      break;
                    }
                    lVar18 = lVar18 + 1;
                    i_1 = lVar18;
                  }
                }
                dateTimeToString::anon_class_16_2_4001139c::operator()(&local_98,iVar12,iVar15);
              }
            }
          }
        }
        i = qVar3 + iVar15;
      }
    }
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar4;
    (__return_storage_ptr__->d).ptr = pcVar5;
    local_88.size = 0;
    (__return_storage_ptr__->d).size = qVar17;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
LAB_002df0b1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QCalendarBackend::dateTimeToString(QStringView format, const QDateTime &datetime,
                                           QDate dateOnly, QTime timeOnly,
                                           const QLocale &locale) const
{
    QDate date;
    QTime time;
    bool formatDate = false;
    bool formatTime = false;
    if (datetime.isValid()) {
        date = datetime.date();
        time = datetime.time();
        formatDate = true;
        formatTime = true;
    } else if (dateOnly.isValid()) {
        date = dateOnly;
        formatDate = true;
    } else if (timeOnly.isValid()) {
        time = timeOnly;
        formatTime = true;
    } else {
        return QString();
    }

    QString result;
    int year = 0, month = 0, day = 0;
    if (formatDate) {
        const auto parts = julianDayToDate(date.toJulianDay());
        if (!parts.isValid())
            return QString();
        year = parts.year;
        month = parts.month;
        day = parts.day;
    }

    auto appendToResult = [&](int t, int repeat) {
        auto data = locale.d->m_data;
        if (repeat > 1)
            result.append(data->longLongToString(t, -1, 10, repeat, QLocaleData::ZeroPadded));
        else
            result.append(data->longLongToString(t));
    };

    auto formatType = [](int repeat) {
        return repeat == 3 ? QLocale::ShortFormat : QLocale::LongFormat;
    };

    qsizetype i = 0;
    while (i < format.size()) {
        if (format.at(i).unicode() == '\'') {
            result.append(qt_readEscapedFormatString(format, &i));
            continue;
        }

        const QChar c = format.at(i);
        qsizetype rep = qt_repeatCount(format.mid(i));
        Q_ASSERT(rep < std::numeric_limits<int>::max());
        int repeat = int(rep);
        bool used = false;
        if (formatDate) {
            switch (c.unicode()) {
            case 'y':
                used = true;
                if (repeat >= 4)
                    repeat = 4;
                else if (repeat >= 2)
                    repeat = 2;

                switch (repeat) {
                case 4:
                    appendToResult(year, (year < 0) ? 5 : 4);
                    break;
                case 2:
                    appendToResult(year % 100, 2);
                    break;
                default:
                    repeat = 1;
                    result.append(c);
                    break;
                }
                break;

            case 'M':
                used = true;
                repeat = qMin(repeat, 4);
                if (repeat <= 2)
                    appendToResult(month, repeat);
                else
                    result.append(monthName(locale, month, year, formatType(repeat)));
                break;

            case 'd':
                used = true;
                repeat = qMin(repeat, 4);
                if (repeat <= 2)
                    appendToResult(day, repeat);
                else
                    result.append(
                            locale.dayName(dayOfWeek(date.toJulianDay()), formatType(repeat)));
                break;

            default:
                break;
            }
        }
        if (!used && formatTime) {
            switch (c.unicode()) {
            case 'h': {
                used = true;
                repeat = qMin(repeat, 2);
                int hour = time.hour();
                if (timeFormatContainsAP(format)) {
                    if (hour > 12)
                        hour -= 12;
                    else if (hour == 0)
                        hour = 12;
                }
                appendToResult(hour, repeat);
                break;
            }
            case 'H':
                used = true;
                repeat = qMin(repeat, 2);
                appendToResult(time.hour(), repeat);
                break;

            case 'm':
                used = true;
                repeat = qMin(repeat, 2);
                appendToResult(time.minute(), repeat);
                break;

            case 's':
                used = true;
                repeat = qMin(repeat, 2);
                appendToResult(time.second(), repeat);
                break;

            case 'A':
            case 'a': {
                QString text = time.hour() < 12 ? locale.amText() : locale.pmText();
                used = true;
                repeat = 1;
                if (format.mid(i + 1).startsWith(u'p', Qt::CaseInsensitive))
                    ++repeat;
                if (c.unicode() == 'A' && (repeat == 1 || format.at(i + 1).unicode() == 'P'))
                    text = std::move(text).toUpper();
                else if (c.unicode() == 'a' && (repeat == 1 || format.at(i + 1).unicode() == 'p'))
                    text = std::move(text).toLower();
                // else 'Ap' or 'aP' => use CLDR text verbatim, preserving case
                result.append(text);
                break;
            }

            case 'z':
                used = true;
                repeat = qMin(repeat, 3);

                // note: the millisecond component is treated like the decimal part of the seconds
                // so ms == 2 is always printed as "002", but ms == 200 can be either "2" or "200"
                appendToResult(time.msec(), 3);
                if (repeat != 3) {
                    if (result.endsWith(locale.zeroDigit()))
                        result.chop(1);
                    if (result.endsWith(locale.zeroDigit()))
                        result.chop(1);
                }
                break;

            case 't': {
                enum AbbrType { Long, Offset, Short };
                const auto tzAbbr = [locale](const QDateTime &when, AbbrType type) {
                    QString text;
                    if (type == Offset) {
                        text = QtTimeZoneLocale::zoneOffsetFormat(locale, locale.d->m_index,
                                                                  QLocale::ShortFormat,
                                                                  when, when.offsetFromUtc());
                        // When using timezone_locale data, this should always succeed:
                        if (!text.isEmpty())
                            return text;
                    }
#if QT_CONFIG(timezone)
                    if (type != Short || locale != QLocale::system()) {
                        QTimeZone::NameType mode =
                            type == Short ? QTimeZone::ShortName
                            : type == Long ? QTimeZone::LongName : QTimeZone::OffsetName;
                        text = when.timeRepresentation().displayName(when, mode, locale);
                        if (!text.isEmpty())
                            return text;
                        // else fall back to an unlocalized one if we can manage it:
                    } // else: prefer QDateTime's abbreviation, for backwards-compatibility.
#endif // else, make do with non-localized abbreviation:
                    // Absent timezone_locale data, Offset might still reach here:
                    if (type == Offset) // Our prior failure might not have tried this:
                        text = when.toOffsetFromUtc(when.offsetFromUtc()).timeZoneAbbreviation();
                    if (text.isEmpty()) // Notably including type != Offset
                        text = when.timeZoneAbbreviation();
                    return type == Offset ? offsetFromAbbreviation(std::move(text)) : text;
                };

                used = true;
                repeat = qMin(repeat, 4);
                // If we don't have a date-time, use the current system time:
                const QDateTime when = formatDate ? datetime : QDateTime::currentDateTime();
                QString text;
                switch (repeat) {
                case 4:
                    text = tzAbbr(when, Long);
                    break;
                case 3: // ±hh:mm
                case 2: // ±hhmm (we'll remove the ':' at the end)
                    text = tzAbbr(when, Offset);
                    if (repeat == 2)
                        text.remove(u':');
                    break;
                default:
                    text = tzAbbr(when, Short);
                    // UTC-offset zones only include minutes if non-zero.
                    if (text.startsWith("UTC"_L1) && text.size() == 6)
                        text += ":00"_L1;
                    break;
                }
                if (!text.isEmpty())
                    result.append(text);
                break;
            }

            default:
                break;
            }
        }
        if (!used)
            result.resize(result.size() + repeat, c);
        i += repeat;
    }

    return result;
}